

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaL_loadfile(lua_State *L,char *filename)

{
  StkId pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  StkId pTVar8;
  int *piVar9;
  char *pcVar10;
  StkId pTVar11;
  ulong uVar12;
  ulong uVar13;
  uint idx;
  bool bVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  LoadF lf;
  undefined4 local_2040 [2];
  FILE *local_2038;
  
  iVar16 = (int)((ulong)((long)L->top - (long)L->base) >> 4);
  idx = iVar16 + 1;
  local_2040[0] = 0;
  if (filename == (char *)0x0) {
    lua_pushlstring(L,"=stdin",6);
    pFVar7 = _stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    pFVar7 = fopen(filename,"r");
    if (pFVar7 == (FILE *)0x0) {
      pcVar10 = "open";
      local_2038 = pFVar7;
      goto LAB_00103d19;
    }
  }
  local_2038 = pFVar7;
  iVar5 = getc(pFVar7);
  if (iVar5 == 0x23) {
    local_2040[0] = 1;
    do {
      iVar5 = getc(pFVar7);
      if (iVar5 == 10) {
        iVar5 = getc(pFVar7);
        goto LAB_00103ae0;
      }
    } while (iVar5 != -1);
    bVar14 = filename != (char *)0x0;
    iVar5 = -1;
  }
  else {
LAB_00103ae0:
    bVar14 = filename != (char *)0x0;
    if (bVar14 && iVar5 == 0x1b) {
      pFVar7 = freopen(filename,"rb",pFVar7);
      local_2038 = pFVar7;
      if (pFVar7 == (FILE *)0x0) {
        pcVar10 = "reopen";
        goto LAB_00103d19;
      }
      do {
        iVar5 = getc(pFVar7);
        if (iVar5 == 0x1b) break;
      } while (iVar5 != -1);
      local_2040[0] = 0;
      bVar14 = true;
    }
  }
  ungetc(iVar5,pFVar7);
  pcVar10 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar5 = lua_load(L,getF,local_2040,pcVar10);
  pFVar7 = local_2038;
  iVar6 = ferror(local_2038);
  if (bVar14) {
    fclose(pFVar7);
  }
  auVar4 = _DAT_00115030;
  auVar3 = _DAT_00115020;
  auVar2 = _DAT_00115010;
  if (iVar6 == 0) {
    lua_remove(L,idx);
    return iVar5;
  }
  if (iVar16 < -1) {
    pTVar8 = L->top + (long)(int)idx + 1;
  }
  else {
    pTVar1 = L->top;
    pTVar8 = L->base + idx;
    if (pTVar1 < pTVar8) {
      pTVar11 = L->base + idx;
      if (pTVar11 <= pTVar1 + 1) {
        pTVar11 = pTVar1 + 1;
      }
      uVar13 = (long)&pTVar11->value + ~(ulong)pTVar1;
      auVar18._8_4_ = (int)uVar13;
      auVar18._0_8_ = uVar13;
      auVar18._12_4_ = (int)(uVar13 >> 0x20);
      auVar15._0_8_ = uVar13 >> 4;
      auVar15._8_8_ = auVar18._8_8_ >> 4;
      piVar9 = &pTVar1[3].tt;
      uVar12 = 0;
      auVar15 = auVar15 ^ _DAT_00115030;
      do {
        auVar17._8_4_ = (int)uVar12;
        auVar17._0_8_ = uVar12;
        auVar17._12_4_ = (int)(uVar12 >> 0x20);
        auVar18 = (auVar17 | auVar3) ^ auVar4;
        iVar16 = auVar15._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                    iVar16 < auVar18._4_4_) & 1)) {
          piVar9[-0xc] = 0;
        }
        if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
            auVar18._12_4_ <= auVar15._12_4_) {
          piVar9[-8] = 0;
        }
        auVar18 = (auVar17 | auVar2) ^ auVar4;
        iVar5 = auVar18._4_4_;
        if (iVar5 <= iVar16 && (iVar5 != iVar16 || auVar18._0_4_ <= auVar15._0_4_)) {
          piVar9[-4] = 0;
          *piVar9 = 0;
        }
        uVar12 = uVar12 + 4;
        piVar9 = piVar9 + 0x10;
      } while (((uVar13 >> 4) + 4 & 0xfffffffffffffffc) != uVar12);
    }
  }
  L->top = pTVar8;
  pcVar10 = "read";
LAB_00103d19:
  errfile(L,pcVar10,idx);
  return 6;
}

Assistant:

static int luaL_loadfile(lua_State*L,const char*filename){
LoadF lf;
int status,readstatus;
int c;
int fnameindex=lua_gettop(L)+1;
lf.extraline=0;
if(filename==NULL){
lua_pushliteral(L,"=stdin");
lf.f=stdin;
}
else{
lua_pushfstring(L,"@%s",filename);
lf.f=fopen(filename,"r");
if(lf.f==NULL)return errfile(L,"open",fnameindex);
}
c=getc(lf.f);
if(c=='#'){
lf.extraline=1;
while((c=getc(lf.f))!=EOF&&c!='\n');
if(c=='\n')c=getc(lf.f);
}
if(c=="\033Lua"[0]&&filename){
lf.f=freopen(filename,"rb",lf.f);
if(lf.f==NULL)return errfile(L,"reopen",fnameindex);
while((c=getc(lf.f))!=EOF&&c!="\033Lua"[0]);
lf.extraline=0;
}
ungetc(c,lf.f);
status=lua_load(L,getF,&lf,lua_tostring(L,-1));
readstatus=ferror(lf.f);
if(filename)fclose(lf.f);
if(readstatus){
lua_settop(L,fnameindex);
return errfile(L,"read",fnameindex);
}
lua_remove(L,fnameindex);
return status;
}